

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<char>::write_double<long_double>
          (BasicWriter<char> *this,longdouble value,FormatSpec *spec)

{
  CharTraits<char> CVar1;
  Alignment AVar2;
  wchar_t wVar3;
  bool bVar4;
  long lVar5;
  ushort uVar6;
  CharTraits<char> CVar7;
  uint uVar8;
  undefined2 *puVar9;
  Buffer<char> *pBVar10;
  uint uVar11;
  char *pcVar12;
  CharTraits<char> CVar13;
  size_t __len_1;
  size_t sVar14;
  ulong uVar15;
  Buffer<char> *pBVar16;
  int in_R9D;
  size_t __len;
  ulong __n;
  Buffer<char> **ppBVar17;
  ulong __n_00;
  byte bVar18;
  CharTraits<char> *pCVar19;
  char *pcVar20;
  bool bVar21;
  char format [10];
  char in_stack_ffffffffffffff6f;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  uint local_80;
  longdouble local_6c;
  undefined1 local_62;
  undefined1 local_61 [2];
  undefined1 auStack_5f [7];
  long local_58;
  ushort uStack_50;
  long local_48;
  ushort uStack_40;
  double local_38;
  
  uVar6 = uStack_50;
  lVar5 = local_58;
  bVar18 = spec->type_;
  uVar11 = bVar18 - 0x41;
  if (uVar11 < 0x27) {
    if ((0x71UL >> ((ulong)uVar11 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar11 & 0x3f) & 1) == 0) goto LAB_0016cc7c;
      goto LAB_0016cb2a;
    }
    bVar4 = true;
  }
  else {
LAB_0016cc7c:
    if (bVar18 != 0) {
      internal::report_unknown_type
                (in_stack_ffffffffffffff6f,
                 (char *)CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70));
    }
    bVar18 = 0x67;
LAB_0016cb2a:
    bVar4 = false;
  }
  local_38 = (double)value;
  uStack_50 = (ushort)((unkuint10)value >> 0x40);
  local_58 = SUB108(value,0);
  if (local_38 < 0.0) {
    local_6c = -value;
    if (NAN(value)) {
      CVar13 = (CharTraits<char>)0x2d;
      goto LAB_0016cf3f;
    }
    CVar13 = (CharTraits<char>)0x2d;
    lVar5 = local_58;
    uVar6 = uStack_50;
    if ((~uStack_50 & 0x7fff) == 0 && local_58 == -0x8000000000000000) goto LAB_0016cc1f;
    pBVar16 = this->buffer_;
    sVar14 = pBVar16->size_;
    uVar11 = (spec->super_AlignSpec).super_WidthSpec.width_;
    CVar13 = (CharTraits<char>)0x2d;
LAB_0016cc90:
    uStack_50 = uVar6;
    local_58 = lVar5;
    if (pBVar16->capacity_ < (uVar11 + (uVar11 == 0)) + sVar14) {
      (**pBVar16->_vptr_Buffer)();
    }
    bVar21 = uVar11 == 0;
    uVar11 = uVar11 - 1;
    bVar4 = false;
    if (bVar21) {
      uVar11 = 0;
    }
    sVar14 = sVar14 + 1;
    uVar8 = spec->flags_;
    lVar5 = local_58;
    uVar6 = uStack_50;
  }
  else {
    uVar8 = spec->flags_;
    CVar13 = (CharTraits<char>)0x2b;
    if ((uVar8 & 2) == 0) {
      CVar13 = (CharTraits<char>)0x20;
    }
    if (NAN(value)) {
      if ((uVar8 & 1) == 0) {
        pcVar12 = " NAN";
        pcVar20 = " nan";
LAB_0016cbf6:
        if (bVar4) {
          pcVar20 = pcVar12;
        }
        write_str<char>(this,pcVar20 + 1,3,&spec->super_AlignSpec);
        return;
      }
LAB_0016cf3f:
      pcVar12 = " NAN";
      pcVar20 = " nan";
      local_58 = lVar5;
      uStack_50 = uVar6;
LAB_0016cc2d:
      if (bVar4) {
        pcVar20 = pcVar12;
      }
      pCVar19 = (CharTraits<char> *)write_str<char>(this,pcVar20,4,&spec->super_AlignSpec);
      *pCVar19 = CVar13;
      return;
    }
    local_48 = local_58;
    uStack_40 = uStack_50;
    if ((~uStack_50 & 0x7fff) == 0 && local_58 == -0x8000000000000000) {
      if ((uVar8 & 1) == 0) {
        pcVar12 = " INF";
        pcVar20 = " inf";
        goto LAB_0016cbf6;
      }
LAB_0016cc1f:
      uStack_50 = uVar6;
      local_58 = lVar5;
      pcVar12 = " INF";
      pcVar20 = " inf";
      goto LAB_0016cc2d;
    }
    pBVar16 = this->buffer_;
    sVar14 = pBVar16->size_;
    uVar11 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if ((uVar8 & 1) != 0) {
      local_6c = value;
      goto LAB_0016cc90;
    }
    CVar13 = (CharTraits<char>)0x0;
    bVar4 = true;
    local_6c = value;
  }
  uStack_50 = uVar6;
  local_58 = lVar5;
  ppBVar17 = &this->buffer_;
  local_62 = 0x25;
  if ((uVar8 & 8) == 0) {
    puVar9 = (undefined2 *)local_61;
  }
  else {
    puVar9 = (undefined2 *)(local_61 + 1);
    local_61[0] = 0x23;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_CENTER) {
LAB_0016ccff:
    uVar11 = 0;
  }
  else {
    if (AVar2 == ALIGN_LEFT) {
      *(undefined1 *)puVar9 = 0x2d;
      puVar9 = (undefined2 *)((long)puVar9 + 1);
    }
    if (uVar11 == 0) goto LAB_0016ccff;
    *(undefined1 *)puVar9 = 0x2a;
    puVar9 = (undefined2 *)((long)puVar9 + 1);
  }
  if (-1 < spec->precision_) {
    *puVar9 = 0x2a2e;
    puVar9 = puVar9 + 1;
  }
  *(undefined1 *)puVar9 = 0x4c;
  *(byte *)((long)puVar9 + 1) = bVar18;
  *(undefined1 *)(puVar9 + 1) = 0;
  wVar3 = (spec->super_AlignSpec).super_WidthSpec.fill_;
LAB_0016cd31:
  while( true ) {
    pCVar19 = (CharTraits<char> *)((*ppBVar17)->ptr_ + sVar14);
    uVar8 = internal::CharTraits<char>::format_float<long_double>
                      (pCVar19,(char *)((*ppBVar17)->capacity_ - sVar14),(size_t)&local_62,
                       (char *)(ulong)uVar11,spec->precision_,in_R9D,local_6c);
    if ((int)uVar8 < 0) goto LAB_0016cd83;
    pBVar16 = *ppBVar17;
    if (uVar8 + sVar14 < pBVar16->capacity_) break;
    uVar15 = uVar8 + sVar14 + 1;
    if (pBVar16->capacity_ < uVar15) goto LAB_0016cd94;
  }
  if (bVar4) {
    CVar13 = (CharTraits<char>)0x0;
    goto LAB_0016cde2;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_RIGHT) {
    CVar1 = *pCVar19;
joined_r0x0016cdd3:
    CVar7 = SUB41(wVar3,0);
    if (CVar1 != (CharTraits<char>)0x20) goto LAB_0016cdd7;
  }
  else {
    if (AVar2 == ALIGN_DEFAULT) {
      CVar1 = *pCVar19;
      goto joined_r0x0016cdd3;
    }
LAB_0016cdd7:
    CVar7 = CVar13;
    CVar13 = (CharTraits<char>)0x0;
  }
  pCVar19[-1] = CVar7;
  uVar8 = uVar8 + 1;
LAB_0016cde2:
  if ((spec->super_AlignSpec).align_ == ALIGN_CENTER) {
    uVar11 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if (uVar8 < uVar11) {
      pBVar16 = *ppBVar17;
      sVar14 = pBVar16->size_;
      uVar15 = sVar14 + uVar11;
      pBVar10 = pBVar16;
      if (pBVar16->capacity_ < uVar15) {
        (**pBVar16->_vptr_Buffer)(pBVar16,uVar15);
        pBVar10 = *ppBVar17;
      }
      pBVar16->size_ = uVar15;
      pcVar20 = pBVar10->ptr_ + sVar14;
      __n_00 = (ulong)uVar8;
      memmove(pcVar20 + (uVar11 - uVar8 >> 1),pcVar20,__n_00);
      uVar11 = (spec->super_AlignSpec).super_WidthSpec.width_;
      uVar15 = uVar11 - __n_00;
      __n = uVar15 >> 1;
      if (1 < uVar15) {
        local_80 = wVar3 & 0xff;
        memset(pcVar20,local_80,__n);
      }
      if (uVar11 == uVar8) {
        return;
      }
      memset(pcVar20 + __n_00 + __n,wVar3 & 0xff,uVar15 - __n);
      return;
    }
  }
  if ((CVar13 != (CharTraits<char>)0x0) || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' '))
  {
    CVar1 = *pCVar19;
    while (CVar1 == (CharTraits<char>)0x20) {
      *pCVar19 = SUB41(wVar3,0);
      CVar1 = pCVar19[1];
      pCVar19 = pCVar19 + 1;
    }
    if (CVar13 != (CharTraits<char>)0x0) {
      pCVar19[-1] = CVar13;
    }
  }
  pBVar16 = *ppBVar17;
  uVar15 = (ulong)uVar8 + pBVar16->size_;
  if (pBVar16->capacity_ < uVar15) {
    (**pBVar16->_vptr_Buffer)(pBVar16,uVar15);
  }
  pBVar16->size_ = uVar15;
  return;
LAB_0016cd83:
  pBVar16 = *ppBVar17;
  if (pBVar16->capacity_ != 0xffffffffffffffff) {
    uVar15 = pBVar16->capacity_ + 1;
LAB_0016cd94:
    (**pBVar16->_vptr_Buffer)(pBVar16,uVar15);
  }
  goto LAB_0016cd31;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}